

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  int iVar1;
  size_t size;
  void *__dest;
  undefined8 *puVar2;
  secp256k1_scalar *s2;
  void *pvVar3;
  secp256k1_scalar *s1;
  undefined8 *in_RCX;
  code *in_R8;
  undefined8 in_R9;
  secp256k1_ge *in_stack_00000008;
  long in_stack_00000010;
  int bucket_window;
  size_t point_idx;
  size_t idx;
  secp256k1_pippenger_state *state_space;
  secp256k1_gej *buckets;
  secp256k1_scalar *scalars;
  secp256k1_ge *points;
  size_t entries;
  size_t scratch_checkpoint;
  secp256k1_gej *in_stack_00000090;
  secp256k1_pippenger_state *in_stack_00000098;
  size_t in_stack_000000c0;
  secp256k1_scratch *in_stack_ffffffffffffff68;
  secp256k1_callback *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  secp256k1_ge *p2;
  secp256k1_scratch *scratch_00;
  secp256k1_ge *psVar4;
  int local_4;
  
  secp256k1_scratch_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffff68,(secp256k1_scratch *)0x11db80);
  size = (long)in_stack_00000008 * 2 + 2;
  scratch_00 = (secp256k1_scratch *)0x0;
  p2 = (secp256k1_ge *)0x0;
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11dbb5);
  if ((in_RCX == (undefined8 *)0x0) && (in_stack_00000008 == (secp256k1_ge *)0x0)) {
    local_4 = 1;
  }
  else {
    iVar1 = secp256k1_pippenger_bucket_window((size_t)in_stack_00000008);
    __dest = secp256k1_scratch_alloc
                       ((secp256k1_callback *)p2,
                        (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    puVar2 = (undefined8 *)
             secp256k1_scratch_alloc
                       ((secp256k1_callback *)p2,
                        (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    s2 = (secp256k1_scalar *)
         secp256k1_scratch_alloc
                   ((secp256k1_callback *)p2,
                    (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff78);
    if ((__dest == (void *)0x0) ||
       ((puVar2 == (undefined8 *)0x0 || (s2 == (secp256k1_scalar *)0x0)))) {
      secp256k1_scratch_apply_checkpoint
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x11dc7d);
      local_4 = 0;
    }
    else {
      pvVar3 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)p2,
                          (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      s2->d[1] = (uint64_t)pvVar3;
      pvVar3 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)p2,
                          (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),size);
      s2->d[0] = (uint64_t)pvVar3;
      s1 = (secp256k1_scalar *)
           secp256k1_scratch_alloc
                     ((secp256k1_callback *)p2,
                      (secp256k1_scratch *)CONCAT44(iVar1,in_stack_ffffffffffffff80),size);
      if (((s2->d[1] == 0) || (s2->d[0] == 0)) || (s1 == (secp256k1_scalar *)0x0)) {
        secp256k1_scratch_apply_checkpoint
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x11dd67);
        local_4 = 0;
      }
      else {
        if (in_RCX != (undefined8 *)0x0) {
          *puVar2 = *in_RCX;
          puVar2[1] = in_RCX[1];
          puVar2[2] = in_RCX[2];
          puVar2[3] = in_RCX[3];
          memcpy(__dest,&secp256k1_ge_const_g,0x58);
          psVar4 = (secp256k1_ge *)(scratch_00->magic + 1);
          secp256k1_ecmult_endo_split(s1,s2,psVar4,p2);
          scratch_00 = (secp256k1_scratch *)((long)(psVar4->x).n + 1);
        }
        for (; p2 < in_stack_00000008; p2 = (secp256k1_ge *)((long)(p2->x).n + 1)) {
          iVar1 = (*in_R8)(puVar2 + (long)scratch_00 * 4,
                           (void *)((long)__dest + (long)scratch_00 * 0x58),
                           (long)(p2->x).n + in_stack_00000010,in_R9);
          if (iVar1 == 0) {
            secp256k1_scratch_apply_checkpoint
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x11de66);
            return 0;
          }
          psVar4 = (secp256k1_ge *)(scratch_00->magic + 1);
          secp256k1_ecmult_endo_split(s1,s2,psVar4,p2);
          scratch_00 = (secp256k1_scratch *)((long)(psVar4->x).n + 1);
        }
        secp256k1_ecmult_pippenger_wnaf
                  ((secp256k1_gej *)cb_offset,n_points._4_4_,in_stack_00000098,in_stack_00000090,
                   (secp256k1_scalar *)error_callback,(secp256k1_ge *)scratch,in_stack_000000c0);
        secp256k1_scratch_apply_checkpoint(in_stack_ffffffffffffff70,scratch_00,0x11df38);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}